

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetVertexBuffers
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 StartSlot,
          Uint32 NumBuffersSet,IBuffer **ppBuffers,Uint64 *pOffsets,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,SET_VERTEX_BUFFERS_FLAGS Flags)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Uint32 UVar3;
  uint uVar4;
  Uint64 UVar5;
  undefined4 in_register_00000014;
  undefined8 uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  BufferVkImpl *pBVar7;
  undefined7 in_register_00000089;
  char (*Args_3) [8];
  ulong uVar8;
  uint uVar9;
  VertexStreamInfo<Diligent::BufferVkImpl> *pVVar10;
  char (*in_stack_ffffffffffffff68) [46];
  Uint32 StartSlot_local;
  string msg;
  uint local_5c;
  uint local_58 [2];
  String local_50;
  
  Args_3 = (char (*) [8])CONCAT71(in_register_00000089,StateTransitionMode);
  uVar6._4_4_ = in_register_00000014;
  uVar6._0_4_ = NumBuffersSet;
  CVar2 = (this->m_Desc).QueueType;
  StartSlot_local = StartSlot;
  local_58 = (uint  [2])uVar6;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetVertexBuffers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x2d2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d2);
    uVar6 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_00;
    }
    CVar2 = (this->m_Desc).QueueType;
  }
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_
              (&local_50,(Diligent *)(ulong)CVar2,(COMMAND_QUEUE_TYPE)uVar6);
    FormatString<char[17],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)"SetVertexBuffers",(char (*) [17])0x7529da,(char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",Args_3
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x1f < StartSlot_local) {
    local_50._M_dataplus._M_p._0_4_ = 0x1f;
    FormatString<char[26],unsigned_int,char[30],unsigned_int,char[3]>
              (&msg,(Diligent *)"Start vertex buffer slot ",(char (*) [26])&StartSlot_local,
               (uint *)0x75ca89,(char (*) [30])&local_50,(uint *)0x6ac87e,
               (char (*) [3])in_stack_ffffffffffffff68);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x20 < StartSlot_local + local_58[0]) {
    local_50._M_dataplus._M_p._0_4_ = (StartSlot_local + local_58[0]) - 1;
    local_5c._0_1_ = '\x1f';
    local_5c._1_1_ = '\0';
    local_5c._2_1_ = '\0';
    local_5c._3_1_ = '\0';
    FormatString<char[45],unsigned_int,char[3],unsigned_int,char[32],unsigned_int,char[3]>
              (&msg,(Diligent *)"The range of vertex buffer slots being set [",
               (char (*) [45])&StartSlot_local,(uint *)0x7b1039,(char (*) [3])&local_50,
               (uint *)"] is out of allowed range  [0, ",(char (*) [32])&local_5c,(uint *)0x6ac87e,
               (char (*) [3])in_stack_ffffffffffffff68);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) &&
     ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0)) {
    FormatString<char[188]>
              (&msg,(char (*) [188])
                    "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2dc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((Flags & SET_VERTEX_BUFFERS_FLAG_RESET) == SET_VERTEX_BUFFERS_FLAG_NONE) {
    uVar9 = this->m_NumVertexStreams;
    UVar3 = StartSlot_local;
  }
  else {
    if (StartSlot_local == 0) {
      UVar3 = 0;
    }
    else {
      pVVar10 = this->m_VertexStreams;
      uVar8 = 0;
      do {
        msg._M_dataplus._M_p = (pointer)0x0;
        msg._M_string_length = 0;
        if ((pVVar10->pBuffer).m_pObject != (BufferVkImpl *)0x0) {
          RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&pVVar10->pBuffer);
          (pVVar10->pBuffer).m_pObject = (BufferVkImpl *)0x0;
        }
        pVVar10->Offset = msg._M_string_length;
        RefCntAutoPtr<Diligent::BufferVkImpl>::Release
                  ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&msg);
        uVar8 = uVar8 + 1;
        pVVar10 = pVVar10 + 1;
        UVar3 = StartSlot_local;
      } while (uVar8 < StartSlot_local);
    }
    uVar9 = local_58[0] + UVar3;
    if (uVar9 < this->m_NumVertexStreams) {
      uVar8 = (ulong)uVar9;
      pVVar10 = this->m_VertexStreams + uVar8;
      do {
        msg._M_dataplus._M_p = (pointer)0x0;
        msg._M_string_length = 0;
        if ((pVVar10->pBuffer).m_pObject != (BufferVkImpl *)0x0) {
          RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&pVVar10->pBuffer);
          (pVVar10->pBuffer).m_pObject = (BufferVkImpl *)0x0;
        }
        pVVar10->Offset = msg._M_string_length;
        RefCntAutoPtr<Diligent::BufferVkImpl>::Release
                  ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&msg);
        uVar8 = uVar8 + 1;
        pVVar10 = pVVar10 + 1;
        UVar3 = StartSlot_local;
      } while (uVar8 < this->m_NumVertexStreams);
    }
    this->m_NumVertexStreams = 0;
    uVar9 = 0;
  }
  uVar4 = UVar3 + local_58[0];
  if (uVar4 < uVar9) {
    uVar4 = uVar9;
  }
  this->m_NumVertexStreams = uVar4;
  local_5c = 0;
  if (local_58[0] != 0) {
    do {
      uVar9 = StartSlot_local + local_5c;
      if ((ppBuffers == (IBuffer **)0x0) ||
         (pBVar7 = (BufferVkImpl *)ppBuffers[local_5c], pBVar7 == (BufferVkImpl *)0x0)) {
        pBVar7 = (BufferVkImpl *)0x0;
      }
      else {
        CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar7);
      }
      pVVar10 = this->m_VertexStreams + uVar9;
      RefCntAutoPtr<Diligent::BufferVkImpl>::operator=(&pVVar10->pBuffer,pBVar7);
      if (pOffsets == (Uint64 *)0x0) {
        UVar5 = 0;
      }
      else {
        UVar5 = pOffsets[local_5c];
      }
      pVVar10->Offset = UVar5;
      pBVar7 = (pVVar10->pBuffer).m_pObject;
      if ((pBVar7 != (BufferVkImpl *)0x0) &&
         (((pBVar7->super_BufferBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           .m_Desc.BindFlags & BIND_VERTEX_BUFFER) == BIND_NONE)) {
        local_50._M_dataplus._M_p =
             (pBVar7->super_BufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             .m_Desc.super_DeviceObjectAttribs.Name;
        if (local_50._M_dataplus._M_p == (char *)0x0) {
          local_50._M_dataplus._M_p = "";
        }
        FormatString<char[9],char_const*,char[40],unsigned_int,char[46]>
                  (&msg,(Diligent *)0x6a62a9,(char (*) [9])&local_50,
                   (char **)"\' being bound as vertex buffer to slot ",(char (*) [40])&local_5c,
                   (uint *)" was not created with BIND_VERTEX_BUFFER flag",in_stack_ffffffffffffff68
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"SetVertexBuffers",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x2f6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      local_5c = local_5c + 1;
    } while (local_5c < local_58[0]);
    uVar4 = this->m_NumVertexStreams;
  }
  if (uVar4 != 0) {
    do {
      if (this->m_VertexStreams[uVar4 - 1].pBuffer.m_pObject != (BufferVkImpl *)0x0) break;
      msg._M_dataplus._M_p = (pointer)0x0;
      msg._M_string_length = 0;
      this->m_NumVertexStreams = uVar4 - 1;
      pVVar10 = this->m_VertexStreams + uVar4;
      if (this->m_VertexStreams[uVar4].pBuffer.m_pObject != (BufferVkImpl *)0x0) {
        RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&pVVar10->pBuffer);
        (pVVar10->pBuffer).m_pObject = (BufferVkImpl *)0x0;
      }
      pVVar10->Offset = msg._M_string_length;
      RefCntAutoPtr<Diligent::BufferVkImpl>::Release((RefCntAutoPtr<Diligent::BufferVkImpl> *)&msg);
      uVar4 = this->m_NumVertexStreams;
    } while (uVar4 != 0);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.SetVertexBuffers;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetVertexBuffers(
    Uint32                         StartSlot,
    Uint32                         NumBuffersSet,
    IBuffer* const*                ppBuffers,
    const Uint64*                  pOffsets,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,
    SET_VERTEX_BUFFERS_FLAGS       Flags)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetVertexBuffers");

    DEV_CHECK_ERR(StartSlot < MAX_BUFFER_SLOTS, "Start vertex buffer slot ", StartSlot, " is out of allowed range [0, ", MAX_BUFFER_SLOTS - 1, "].");

    DEV_CHECK_ERR(StartSlot + NumBuffersSet <= MAX_BUFFER_SLOTS,
                  "The range of vertex buffer slots being set [", StartSlot, ", ", StartSlot + NumBuffersSet - 1,
                  "] is out of allowed range  [0, ", MAX_BUFFER_SLOTS - 1, "].");

    DEV_CHECK_ERR(!(m_pActiveRenderPass != nullptr && StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION),
                  "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. "
                  "Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first.");

    if (Flags & SET_VERTEX_BUFFERS_FLAG_RESET)
    {
        // Reset only these buffer slots that are not being set.
        // It is very important to not reset buffers that stay unchanged
        // as AddRef()/Release() are not free
        for (Uint32 s = 0; s < StartSlot; ++s)
            m_VertexStreams[s] = VertexStreamInfo<BufferImplType>{};
        for (Uint32 s = StartSlot + NumBuffersSet; s < m_NumVertexStreams; ++s)
            m_VertexStreams[s] = VertexStreamInfo<BufferImplType>{};
        m_NumVertexStreams = 0;
    }
    m_NumVertexStreams = (std::max)(m_NumVertexStreams, StartSlot + NumBuffersSet);

    for (Uint32 Buff = 0; Buff < NumBuffersSet; ++Buff)
    {
        VertexStreamInfo<BufferImplType>& CurrStream{m_VertexStreams[StartSlot + Buff]};
        CurrStream.pBuffer = ppBuffers ? ClassPtrCast<BufferImplType>(ppBuffers[Buff]) : nullptr;
        CurrStream.Offset  = pOffsets ? pOffsets[Buff] : 0;
#ifdef DILIGENT_DEVELOPMENT
        if (CurrStream.pBuffer)
        {
            const BufferDesc& BuffDesc = CurrStream.pBuffer->GetDesc();
            DEV_CHECK_ERR((BuffDesc.BindFlags & BIND_VERTEX_BUFFER) != 0,
                          "Buffer '", BuffDesc.Name ? BuffDesc.Name : "", "' being bound as vertex buffer to slot ", Buff,
                          " was not created with BIND_VERTEX_BUFFER flag");
        }
#endif
    }
    // Remove null buffers from the end of the array
    while (m_NumVertexStreams > 0 && !m_VertexStreams[m_NumVertexStreams - 1].pBuffer)
        m_VertexStreams[m_NumVertexStreams--] = VertexStreamInfo<BufferImplType>{};

    ++m_Stats.CommandCounters.SetVertexBuffers;
}